

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::~DBImpl(DBImpl *this)

{
  DB *in_RDI;
  MemTable *in_stack_ffffffffffffffb0;
  atomic<bool> *in_stack_ffffffffffffffb8;
  CondVar *in_stack_ffffffffffffffc0;
  _func_int **pp_Var1;
  VersionSet *in_stack_ffffffffffffffd0;
  Writer *this_00;
  deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
  *in_stack_fffffffffffffff0;
  
  in_RDI->_vptr_DB = (_func_int **)&PTR__DBImpl_00160150;
  port::Mutex::Lock((Mutex *)0x10e66d);
  std::atomic<bool>::store
            (in_stack_ffffffffffffffb8,SUB81((ulong)in_stack_ffffffffffffffb0 >> 0x38,0),
             (memory_order)in_stack_ffffffffffffffb0);
  while (((ulong)in_RDI[0x142]._vptr_DB & 1) != 0) {
    port::CondVar::Wait(in_stack_ffffffffffffffc0);
  }
  port::Mutex::Unlock((Mutex *)0x10e6ba);
  if (in_RDI[0x118]._vptr_DB != (_func_int **)0x0) {
    (**(code **)(*in_RDI[1]._vptr_DB + 0x70))
              (&stack0xfffffffffffffff0,in_RDI[1]._vptr_DB,in_RDI[0x118]._vptr_DB);
    Status::~Status((Status *)in_stack_ffffffffffffffb0);
  }
  pp_Var1 = in_RDI[0x144]._vptr_DB;
  if (pp_Var1 != (_func_int **)0x0) {
    VersionSet::~VersionSet(in_stack_ffffffffffffffd0);
    operator_delete(pp_Var1,0x250);
  }
  if (in_RDI[0x126]._vptr_DB != (_func_int **)0x0) {
    MemTable::Unref(in_stack_ffffffffffffffb0);
  }
  if (in_RDI[0x127]._vptr_DB != (_func_int **)0x0) {
    MemTable::Unref(in_stack_ffffffffffffffb0);
  }
  pp_Var1 = in_RDI[0x137]._vptr_DB;
  if (pp_Var1 != (_func_int **)0x0) {
    WriteBatch::~WriteBatch((WriteBatch *)0x10e77f);
    operator_delete(pp_Var1,0x20);
  }
  this_00 = (Writer *)in_RDI[299]._vptr_DB;
  if (this_00 != (Writer *)0x0) {
    log::Writer::~Writer(this_00);
    operator_delete(this_00,0x20);
  }
  if (in_RDI[0x129]._vptr_DB != (_func_int **)0x0) {
    (**(code **)(*in_RDI[0x129]._vptr_DB + 8))();
  }
  pp_Var1 = in_RDI[0x117]._vptr_DB;
  if (pp_Var1 != (_func_int **)0x0) {
    TableCache::~TableCache((TableCache *)in_stack_ffffffffffffffb0);
    operator_delete(pp_Var1,0x38);
  }
  if ((((ulong)in_RDI[0x112]._vptr_DB & 1) != 0) && (in_RDI[9]._vptr_DB != (_func_int **)0x0)) {
    (**(code **)(*in_RDI[9]._vptr_DB + 8))();
  }
  if ((((ulong)in_RDI[0x112]._vptr_DB & 0x100) != 0) &&
     (in_stack_ffffffffffffffb0 = (MemTable *)in_RDI[0xc]._vptr_DB,
     in_stack_ffffffffffffffb0 != (MemTable *)0x0)) {
    (*(in_stack_ffffffffffffffb0->comparator_).comparator.super_Comparator._vptr_Comparator[1])();
  }
  Status::~Status((Status *)in_stack_ffffffffffffffb0);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x10e890);
  SnapshotList::~SnapshotList((SnapshotList *)0x10e8a1);
  std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::~deque
            (in_stack_fffffffffffffff0);
  port::CondVar::~CondVar((CondVar *)0x10e8c3);
  std::__cxx11::string::~string((string *)(in_RDI + 0x113));
  InternalFilterPolicy::~InternalFilterPolicy((InternalFilterPolicy *)0x10e8e2);
  InternalKeyComparator::~InternalKeyComparator((InternalKeyComparator *)0x10e8f0);
  DB::~DB(in_RDI);
  return;
}

Assistant:

DBImpl::~DBImpl() {
  // Wait for background work to finish.
  mutex_.Lock();
  shutting_down_.store(true, std::memory_order_release);
  while (background_compaction_scheduled_) {
    background_work_finished_signal_.Wait();
  }
  mutex_.Unlock();

  if (db_lock_ != nullptr) {
    env_->UnlockFile(db_lock_);
  }

  delete versions_;
  if (mem_ != nullptr) mem_->Unref();
  if (imm_ != nullptr) imm_->Unref();
  delete tmp_batch_;
  delete log_;
  delete logfile_;
  delete table_cache_;

  if (owns_info_log_) {
    delete options_.info_log;
  }
  if (owns_cache_) {
    delete options_.block_cache;
  }
}